

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessbackend_p.cpp
# Opt level: O0

void QNetworkAccessBackend::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QMetaType QVar2;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  QNetworkAccessBackend *in_RDI;
  long in_FS_OFFSET;
  QNetworkAccessBackend *_t;
  QAuthenticator *in_stack_ffffffffffffffe0;
  QMetaType in_stack_ffffffffffffffe8;
  QMetaType in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch((QUrl *)(ulong)in_EDX) {
    case (QUrl *)0x0:
      readyRead((QNetworkAccessBackend *)0x18969e);
      break;
    case (QUrl *)0x1:
      finished((QNetworkAccessBackend *)0x1896ad);
      break;
    case (QUrl *)0x2:
      error(in_RDI,NoError,(QString *)0x1896cd);
      break;
    case (QUrl *)0x3:
      proxyAuthenticationRequired
                ((QNetworkAccessBackend *)in_stack_fffffffffffffff0.d_ptr,
                 (QNetworkProxy *)in_stack_ffffffffffffffe8.d_ptr,in_stack_ffffffffffffffe0);
      break;
    case (QUrl *)0x4:
      authenticationRequired
                ((QNetworkAccessBackend *)in_stack_fffffffffffffff0.d_ptr,
                 (QAuthenticator *)in_stack_ffffffffffffffe8.d_ptr);
      break;
    case (QUrl *)0x5:
      metaDataChanged((QNetworkAccessBackend *)0x189712);
      break;
    case (QUrl *)0x6:
      redirectionRequested(in_RDI,(QUrl *)(ulong)in_EDX);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 2) {
      if (*(int *)in_RCX[1] == 0) {
        QVar2 = QMetaType::fromType<QNetworkReply::NetworkError>();
        *(QMetaTypeInterface **)*in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&stack0xffffffffffffffe8,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xffffffffffffffe8);
        *(QMetaTypeInterface **)*in_RCX = in_stack_ffffffffffffffe8.d_ptr;
      }
    }
    else {
      memset(&stack0xfffffffffffffff0,0,8);
      QMetaType::QMetaType((QMetaType *)&stack0xfffffffffffffff0);
      *(QMetaTypeInterface **)*in_RCX = in_stack_fffffffffffffff0.d_ptr;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessBackend::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkAccessBackend *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->readyRead(); break;
        case 1: _t->finished(); break;
        case 2: _t->error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 4: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[1]))); break;
        case 5: _t->metaDataChanged(); break;
        case 6: _t->redirectionRequested((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        }
    }
}